

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int regexpTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  FILE *__stream;
  char *__filename;
  FILE *__stream_00;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  char *pattern;
  int res;
  int ret;
  int len;
  char expression [5000];
  char *temp;
  FILE *output;
  FILE *input;
  xmlRegexpPtr comp;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  input = (FILE *)0x0;
  pattern._4_4_ = 0;
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler);
  nb_tests = nb_tests + 1;
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    __filename = resultFilename(filename,"",".res");
    if (__filename == (char *)0x0) {
      fprintf(_stderr,"Out of memory\n");
      fatalError();
    }
    __stream_00 = fopen64(__filename,"wb");
    if (__stream_00 == (FILE *)0x0) {
      fprintf(_stderr,"failed to open output file %s\n",__filename);
      free(__filename);
    }
    else {
      do {
        while( true ) {
          while( true ) {
            do {
              pcVar2 = fgets((char *)&ret,0x1194,__stream);
              if (pcVar2 == (char *)0x0) goto LAB_0010bf19;
              sVar3 = strlen((char *)&ret);
              res = (int)sVar3;
              do {
                iVar1 = res;
                res = iVar1 + -1;
                bVar4 = false;
                if ((((-1 < res) && (bVar4 = true, *(char *)((long)&ret + (long)res) != '\n')) &&
                    (bVar4 = true, *(char *)((long)&ret + (long)res) != '\t')) &&
                   (bVar4 = true, *(char *)((long)&ret + (long)res) != '\r')) {
                  bVar4 = *(char *)((long)&ret + (long)res) == ' ';
                }
              } while (bVar4);
              *(undefined1 *)((long)&ret + (long)iVar1) = 0;
            } while ((res < 0) || ((char)ret == '#'));
            if (((char)ret != '=') || (ret._1_1_ != '>')) break;
            if (input != (FILE *)0x0) {
              xmlRegFreeRegexp(input);
            }
            fprintf(__stream_00,"Regexp: %s\n",(long)&ret + 2);
            input = (FILE *)xmlRegexpCompile((long)&ret + 2);
            if (input == (FILE *)0x0) {
              fprintf(__stream_00,"   failed to compile\n");
              goto LAB_0010bf19;
            }
          }
          if (input == (FILE *)0x0) break;
          if (input != (FILE *)0x0) {
            testRegexp((FILE *)__stream_00,(xmlRegexpPtr)input,(char *)&ret);
          }
        }
        fprintf(__stream_00,"Regexp: %s\n",&ret);
        input = (FILE *)xmlRegexpCompile(&ret);
      } while (input != (FILE *)0x0);
      fprintf(__stream_00,"   failed to compile\n");
LAB_0010bf19:
      fclose(__stream_00);
      fclose(__stream);
      if (input != (FILE *)0x0) {
        xmlRegFreeRegexp(input);
      }
      iVar1 = compareFiles(__filename,result);
      if (iVar1 != 0) {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
      }
      pattern._4_4_ = (uint)(iVar1 != 0);
      if (__filename != (char *)0x0) {
        unlink(__filename);
        free(__filename);
      }
      iVar1 = compareFileMem(err,testErrors,testErrorsSize);
      if (iVar1 != 0) {
        fprintf(_stderr,"Error for %s failed\n",filename);
        pattern._4_4_ = 1;
      }
    }
  }
  xmlSetStructuredErrorFunc(0);
  return pattern._4_4_;
}

Assistant:

static int
regexpTest(const char *filename, const char *result, const char *err,
	   int options ATTRIBUTE_UNUSED) {
    xmlRegexpPtr comp = NULL;
    FILE *input, *output;
    char *temp;
    char expression[5000];
    int len, ret, res = 0;

    /*
     * TODO: Custom error handler for regexp
     */
    xmlSetStructuredErrorFunc(NULL, testStructuredErrorHandler);

    nb_tests++;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	ret = -1;
        goto done;
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	ret = -1;
        goto done;
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    if (expression[0] == '#')
		continue;
	    if ((expression[0] == '=') && (expression[1] == '>')) {
		char *pattern = &expression[2];

		if (comp != NULL) {
		    xmlRegFreeRegexp(comp);
		    comp = NULL;
		}
		fprintf(output, "Regexp: %s\n", pattern) ;
		comp = xmlRegexpCompile((const xmlChar *) pattern);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp == NULL) {
		fprintf(output, "Regexp: %s\n", expression) ;
		comp = xmlRegexpCompile((const xmlChar *) expression);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp != NULL) {
		testRegexp(output, comp, expression);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (comp != NULL)
	xmlRegFreeRegexp(comp);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    ret = compareFileMem(err, testErrors, testErrorsSize);
    if (ret != 0) {
        fprintf(stderr, "Error for %s failed\n", filename);
        res = 1;
    }

done:
    xmlSetStructuredErrorFunc(NULL, NULL);

    return(res);
}